

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::HttpHeaderId> * __thiscall
kj::HttpHeaderTable::stringToId
          (Maybe<kj::HttpHeaderId> *__return_storage_ptr__,HttpHeaderTable *this,StringPtr name)

{
  bool bVar1;
  unordered_map<kj::StringPtr,_unsigned_int,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>_>
  *puVar2;
  pointer pvVar3;
  HttpHeaderId local_50;
  _Node_iterator_base<std::pair<const_kj::StringPtr,_unsigned_int>,_true> local_38;
  _Node_iterator_base<std::pair<const_kj::StringPtr,_unsigned_int>,_true> local_30;
  const_iterator iter;
  HttpHeaderTable *this_local;
  StringPtr name_local;
  
  name_local.content.ptr = (char *)name.content.size_;
  this_local = (HttpHeaderTable *)name.content.ptr;
  iter.super__Node_iterator_base<std::pair<const_kj::StringPtr,_unsigned_int>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_kj::StringPtr,_unsigned_int>,_true>)
       (_Node_iterator_base<std::pair<const_kj::StringPtr,_unsigned_int>,_true>)this;
  name_local.content.size_ = (size_t)__return_storage_ptr__;
  puVar2 = &Own<kj::HttpHeaderTable::IdsByNameMap,_std::nullptr_t>::operator->(&this->idsByName)->
            map;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<kj::StringPtr,_unsigned_int,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>_>
       ::find(puVar2,(key_type *)&this_local);
  puVar2 = &Own<kj::HttpHeaderTable::IdsByNameMap,_std::nullptr_t>::operator->(&this->idsByName)->
            map;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<kj::StringPtr,_unsigned_int,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>_>
       ::end(puVar2);
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (bVar1) {
    Maybe<kj::HttpHeaderId>::Maybe(__return_storage_ptr__);
  }
  else {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_kj::StringPtr,_unsigned_int>,_false,_true>::
             operator->((_Node_const_iterator<std::pair<const_kj::StringPtr,_unsigned_int>,_false,_true>
                         *)&local_30);
    HttpHeaderId::HttpHeaderId(&local_50,this,pvVar3->second);
    Maybe<kj::HttpHeaderId>::Maybe(__return_storage_ptr__,&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<HttpHeaderId> HttpHeaderTable::stringToId(kj::StringPtr name) const {
  auto iter = idsByName->map.find(name);
  if (iter == idsByName->map.end()) {
    return kj::none;
  } else {
    return HttpHeaderId(this, iter->second);
  }
}